

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeFabricEdgeGetVerticesExp
          (ze_fabric_edge_handle_t hEdge,ze_fabric_vertex_handle_t *phVertexA,
          ze_fabric_vertex_handle_t *phVertexB)

{
  _func_void__ze_fabric_edge_get_vertices_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_fabric_edge_handle_t_ptr__ze_fabric_vertex_handle_t_ptr_ptr__ze_fabric_vertex_handle_t_ptr_ptr
  *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_100;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_e8;
  undefined1 local_d0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnFabricEdgeGetVerticesExpCb_t epilogue_callback_ptr;
  ze_pfnFabricEdgeGetVerticesExpCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_fabric_edge_get_vertices_exp_params_t tracerParams;
  ze_pfnFabricEdgeGetVerticesExp_t pfnGetVerticesExp;
  ze_fabric_vertex_handle_t *phVertexB_local;
  ze_fabric_vertex_handle_t *phVertexA_local;
  ze_fabric_edge_handle_t hEdge_local;
  
  if (_DAT_002da888 ==
      (_func__ze_result_t__ze_fabric_edge_handle_t_ptr__ze_fabric_vertex_handle_t_ptr_ptr__ze_fabric_vertex_handle_t_ptr_ptr
       *)0x0) {
    hEdge_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnGetVerticesExp = (ze_pfnFabricEdgeGetVerticesExp_t)phVertexB;
    phVertexB_local = phVertexA;
    phVertexA_local = (ze_fabric_vertex_handle_t *)hEdge;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&phVertexA_local;
      APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnFabricEdgeGetVerticesExpCb_t)0x0;
            prologueCallbackPtr < (ze_pfnFabricEdgeGetVerticesExpCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x628);
          p_Var1 = *(_func_void__ze_fabric_edge_get_vertices_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0xc80);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_fabric_edge_get_vertices_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_d0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_d0)
          ;
        }
      }
      zeApiPtr = _DAT_002da888;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_e8,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_100,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hEdge_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_fabric_edge_handle_t*,_ze_fabric_vertex_handle_t**,_ze_fabric_vertex_handle_t**),_ze_fabric_edge_get_vertices_exp_params_t*,void(*)(_ze_fabric_edge_get_vertices_exp_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_fabric_edge_get_vertices_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_fabric_edge_get_vertices_exp_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_fabric_edge_get_vertices_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_fabric_edge_get_vertices_exp_params_t*,_ze_result_t,void*,void**)>>>,_ze_fabric_edge_handle_t*&,_ze_fabric_vertex_handle_t**&,_ze_fabric_vertex_handle_t**&>
                     (zeApiPtr,(_ze_fabric_edge_get_vertices_exp_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_fabric_edge_get_vertices_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_e8,&local_100,
                      (_ze_fabric_edge_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&phVertexB_local,
                      (_ze_fabric_vertex_handle_t ***)&pfnGetVerticesExp);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_100);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_e8);
      APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_vertices_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hEdge_local._4_4_ =
           (*_DAT_002da888)((_ze_fabric_edge_handle_t *)phVertexA_local,phVertexB_local,
                            (_ze_fabric_vertex_handle_t **)pfnGetVerticesExp);
    }
  }
  return hEdge_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetVerticesExp(
        ze_fabric_edge_handle_t hEdge,                  ///< [in] handle of the fabric edge instance
        ze_fabric_vertex_handle_t* phVertexA,           ///< [out] fabric vertex connected to one end of the given fabric edge.
        ze_fabric_vertex_handle_t* phVertexB            ///< [out] fabric vertex connected to other end of the given fabric edge.
        )
    {
        auto pfnGetVerticesExp = context.zeDdiTable.FabricEdgeExp.pfnGetVerticesExp;

        if( nullptr == pfnGetVerticesExp)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.FabricEdgeExp.pfnGetVerticesExp, hEdge, phVertexA, phVertexB);

        // capture parameters
        ze_fabric_edge_get_vertices_exp_params_t tracerParams = {
            &hEdge,
            &phVertexA,
            &phVertexB
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnFabricEdgeGetVerticesExpCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnFabricEdgeGetVerticesExpCb_t, FabricEdge, pfnGetVerticesExpCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.FabricEdgeExp.pfnGetVerticesExp,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phEdge,
                                                  *tracerParams.pphVertexA,
                                                  *tracerParams.pphVertexB);
    }